

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Sfm_DecPrintStats(Sfm_Dec_t *p)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  timespec local_40;
  
  printf("Node = %d. Try = %d. Change = %d.   Const0 = %d. Const1 = %d. Buf = %d. Inv = %d. Gate = %d. AndOr = %d. Effort = %d.  NoDec = %d.\n"
         ,(ulong)(uint)p->nTotalNodesBeg,(ulong)(uint)p->nNodesTried,(ulong)(uint)p->nNodesChanged,
         (ulong)(uint)p->nNodesConst0,(ulong)(uint)p->nNodesConst1,(ulong)(uint)p->nNodesBuf,
         (ulong)(uint)p->nNodesInv,(ulong)(uint)p->nNodesResyn,(ulong)(uint)p->nNodesAndOr,
         (ulong)(uint)p->nEfforts,(ulong)(uint)p->nNoDecs);
  uVar4 = 1;
  if (1 < p->nNodesTried) {
    uVar4 = (ulong)(uint)p->nNodesTried;
  }
  printf("MaxDiv = %d. MaxWin = %d.   AveDiv = %d. AveWin = %d.   Calls = %d. (Sat = %d. Unsat = %d.)  Over = %d.  T/O = %d.\n"
         ,(ulong)(uint)p->nMaxDivs,(ulong)(uint)p->nMaxWin,p->nAllDivs / uVar4 & 0xffffffff,
         p->nAllWin / uVar4 & 0xffffffff,(ulong)(uint)p->nSatCalls,(ulong)(uint)p->nSatCallsSat,
         (ulong)(uint)p->nSatCallsUnsat,(ulong)(uint)p->nSatCallsOver,(ulong)(uint)p->nTimeOuts);
  iVar3 = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar2 = -1;
  }
  else {
    lVar2 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  lVar2 = lVar2 - p->timeStart;
  p->timeTotal = lVar2;
  p->timeOther = lVar2 - (p->timeLib + p->timeWin + p->timeCnf + p->timeSat + p->timeTime);
  uVar4 = 0;
  Abc_Print(iVar3,"%s =","Lib   ");
  dVar5 = 0.0;
  if (p->timeTotal != 0) {
    dVar5 = ((double)p->timeLib * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeLib / 1000000.0,dVar5);
  Abc_Print(iVar3,"%s =","Win   ");
  dVar5 = 0.0;
  if (p->timeTotal != 0) {
    dVar5 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeWin / 1000000.0,dVar5);
  Abc_Print(iVar3,"%s =","Cnf   ");
  dVar5 = 0.0;
  if (p->timeTotal != 0) {
    dVar5 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeCnf / 1000000.0,dVar5);
  Abc_Print(iVar3,"%s =","Sat   ");
  dVar6 = (double)(p->timeSat - p->timeEval);
  dVar5 = 0.0;
  if (p->timeTotal != 0) {
    dVar5 = (dVar6 * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",dVar6 / 1000000.0,dVar5);
  Abc_Print(iVar3,"%s ="," Sat  ");
  dVar5 = 0.0;
  if (p->timeTotal != 0) {
    dVar5 = ((double)p->timeSatSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatSat / 1000000.0,dVar5);
  Abc_Print(iVar3,"%s ="," Unsat");
  dVar5 = 0.0;
  if (p->timeTotal != 0) {
    dVar5 = ((double)p->timeSatUnsat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUnsat / 1000000.0,dVar5);
  Abc_Print(iVar3,"%s =","Eval  ");
  dVar5 = 0.0;
  if (p->timeTotal != 0) {
    dVar5 = ((double)p->timeEval * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeEval / 1000000.0,dVar5);
  Abc_Print(iVar3,"%s =","Timing");
  dVar5 = 0.0;
  if (p->timeTotal != 0) {
    dVar5 = ((double)p->timeTime * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeTime / 1000000.0,dVar5);
  Abc_Print(iVar3,"%s =","Other ");
  dVar5 = 0.0;
  if (p->timeTotal != 0) {
    dVar5 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar5);
  Abc_Print(iVar3,"%s =","ALL   ");
  dVar6 = (double)p->timeTotal;
  dVar5 = 0.0;
  if (p->timeTotal != 0) {
    dVar5 = (dVar6 * 100.0) / dVar6;
  }
  Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",dVar6 / 1000000.0,dVar5);
  printf("Cone sizes:  ");
  do {
    if (p->nLuckySizes[uVar4] != 0) {
      printf("%d=%d  ",uVar4 & 0xffffffff);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 9);
  printf("  ");
  printf("Gate sizes:  ");
  uVar4 = 0;
  do {
    if (p->nLuckyGates[uVar4] != 0) {
      printf("%d=%d  ",uVar4 & 0xffffffff);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 9);
  putchar(10);
  printf("Reduction:   ");
  iVar1 = p->nTotalNodesBeg;
  iVar3 = 1;
  if (1 < iVar1) {
    iVar3 = iVar1;
  }
  printf("Nodes  %6d out of %6d (%6.2f %%)   ",
         ((double)(iVar1 - p->nTotalNodesEnd) * 100.0) / (double)iVar3);
  iVar1 = p->nTotalEdgesBeg;
  iVar3 = 1;
  if (1 < iVar1) {
    iVar3 = iVar1;
  }
  printf("Edges  %6d out of %6d (%6.2f %%)   ",
         ((double)(iVar1 - p->nTotalEdgesEnd) * 100.0) / (double)iVar3);
  putchar(10);
  return;
}

Assistant:

void Sfm_DecPrintStats( Sfm_Dec_t * p )
{
    int i;
    printf( "Node = %d. Try = %d. Change = %d.   Const0 = %d. Const1 = %d. Buf = %d. Inv = %d. Gate = %d. AndOr = %d. Effort = %d.  NoDec = %d.\n",
        p->nTotalNodesBeg, p->nNodesTried, p->nNodesChanged, p->nNodesConst0, p->nNodesConst1, p->nNodesBuf, p->nNodesInv, p->nNodesResyn, p->nNodesAndOr, p->nEfforts, p->nNoDecs );
    printf( "MaxDiv = %d. MaxWin = %d.   AveDiv = %d. AveWin = %d.   Calls = %d. (Sat = %d. Unsat = %d.)  Over = %d.  T/O = %d.\n",
        p->nMaxDivs, p->nMaxWin, (int)(p->nAllDivs/Abc_MaxInt(1, p->nNodesTried)), (int)(p->nAllWin/Abc_MaxInt(1, p->nNodesTried)), p->nSatCalls, p->nSatCallsSat, p->nSatCallsUnsat, p->nSatCallsOver, p->nTimeOuts );

    p->timeTotal = Abc_Clock() - p->timeStart;
    p->timeOther = p->timeTotal - p->timeLib - p->timeWin - p->timeCnf - p->timeSat - p->timeTime;

    ABC_PRTP( "Lib   ", p->timeLib  ,           p->timeTotal );
    ABC_PRTP( "Win   ", p->timeWin  ,           p->timeTotal );
    ABC_PRTP( "Cnf   ", p->timeCnf  ,           p->timeTotal );
    ABC_PRTP( "Sat   ", p->timeSat-p->timeEval, p->timeTotal );
    ABC_PRTP( " Sat  ", p->timeSatSat,          p->timeTotal );
    ABC_PRTP( " Unsat", p->timeSatUnsat,        p->timeTotal );
    ABC_PRTP( "Eval  ", p->timeEval ,           p->timeTotal );
    ABC_PRTP( "Timing", p->timeTime ,           p->timeTotal );
    ABC_PRTP( "Other ", p->timeOther,           p->timeTotal );
    ABC_PRTP( "ALL   ", p->timeTotal,           p->timeTotal );

    printf( "Cone sizes:  " );
    for ( i = 0; i <= SFM_SUPP_MAX; i++ )
        if ( p->nLuckySizes[i] )
            printf( "%d=%d  ", i, p->nLuckySizes[i] );
    printf( "  " );

    printf( "Gate sizes:  " );
    for ( i = 0; i <= SFM_SUPP_MAX; i++ )
        if ( p->nLuckyGates[i] )
            printf( "%d=%d  ", i, p->nLuckyGates[i] );
    printf( "\n" );

    printf( "Reduction:   " );
    printf( "Nodes  %6d out of %6d (%6.2f %%)   ", p->nTotalNodesBeg-p->nTotalNodesEnd, p->nTotalNodesBeg, 100.0*(p->nTotalNodesBeg-p->nTotalNodesEnd)/Abc_MaxInt(1, p->nTotalNodesBeg) );
    printf( "Edges  %6d out of %6d (%6.2f %%)   ", p->nTotalEdgesBeg-p->nTotalEdgesEnd, p->nTotalEdgesBeg, 100.0*(p->nTotalEdgesBeg-p->nTotalEdgesEnd)/Abc_MaxInt(1, p->nTotalEdgesBeg) );
    printf( "\n" );
}